

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

void inner_update_cb_state_and_predict(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = ABS(x);
  if (ABS(x) <= wref[3]) {
    fVar1 = wref[3];
  }
  fVar3 = wref[5] * fVar1;
  fVar2 = 0.0;
  if (0.0 < fVar3) {
    fVar2 = ((d->ftrl_alpha + wref[4]) * wref[1]) / ((wref[2] + fVar3) * fVar3);
  }
  d->predict = fVar2 * x + d->predict;
  if (0.0 < fVar1) {
    d->normalized_squared_norm_x = (x * x) / (fVar1 * fVar1) + d->normalized_squared_norm_x;
  }
  return;
}

Assistant:

void inner_update_cb_state_and_predict(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float w_mx = w[W_MX];
  float w_xt = 0.0;

  float fabs_x = fabs(x);
  if (fabs_x > w_mx) {
    w_mx = fabs_x;
  }

  // COCOB update without sigmoid
  if (w[W_MG]*w_mx>0)
    w_xt = (d.ftrl_alpha+w[W_WE]) * w[W_ZT]/(w[W_MG]*w_mx*(w[W_MG]*w_mx+w[W_G2]));

  d.predict += w_xt * x;
  if (w_mx>0)
    d.normalized_squared_norm_x += x*x/(w_mx*w_mx);
}